

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O0

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  bool bVar1;
  undefined7 extraout_var;
  reference this_00;
  pointer stmt_00;
  undefined4 in_register_00000034;
  unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *stmt;
  iterator __end2;
  iterator __begin2;
  CompoundStmt *__range2;
  CompoundStmt *compoundStmt_local;
  IRGenerator *this_local;
  
  __end2 = CompoundStmt::begin((CompoundStmt *)CONCAT44(in_register_00000034,__fd));
  stmt = (unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *)
         CompoundStmt::end((CompoundStmt *)CONCAT44(in_register_00000034,__fd));
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&stmt);
    if (!bVar1) break;
    this_00 = std::
              _List_iterator<std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>_>
              ::operator*(&__end2);
    stmt_00 = std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>::get
                        (this_00);
    codegen(this,stmt_00);
    std::_List_iterator<std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>_>
    ::operator++(&__end2);
  }
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

void IRGenerator::accept(CompoundStmt& compoundStmt) {
  for (const auto& stmt : compoundStmt) {
    codegen(stmt.get());
  }
}